

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O1

void __thiscall
UnitBoundedPolynomial<3U,_2U>::walk
          (UnitBoundedPolynomial<3U,_2U> *this,double deltatau,
          _func_void_VectorNd_double_UnitBoundedPolynomial<3U,_2U>_ptr_void_ptr *fn,void *payload,
          double a,double b)

{
  UnitBoundedPolynomial<3U,_2U> *pUVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  double dVar6;
  double tau;
  double dVar7;
  double dVar8;
  double dVar9;
  VectorNd VVar10;
  VectorNd p;
  
  if (a <= b) {
    do {
      uVar5 = -(ulong)(b - a < deltatau);
      dVar9 = (double)(~uVar5 & (ulong)a | uVar5 & (ulong)b);
      pUVar1 = this;
      lVar2 = 0;
      do {
        dVar6 = 0.0;
        lVar3 = 0;
        dVar7 = 1.0;
        do {
          dVar8 = dVar9 * dVar7;
          dVar6 = dVar6 + dVar7 * pUVar1->_dims[0].coeffs[lVar3];
          lVar3 = lVar3 + 1;
          dVar7 = dVar8;
        } while (lVar3 != 4);
        *(double *)(&stack0xffffffffffffffc8 + lVar2 * 8) = dVar6;
        pUVar1 = (UnitBoundedPolynomial<3U,_2U> *)(pUVar1->_dims + 1);
        bVar4 = lVar2 == 0;
        lVar2 = lVar2 + 1;
      } while (bVar4);
      VVar10.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
           = dVar8;
      VVar10.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
           = dVar9;
      (*fn)(VVar10,dVar8,(UnitBoundedPolynomial<3U,_2U> *)&stack0xffffffffffffffc8,this);
      a = dVar9 + deltatau;
    } while (a <= b);
  }
  return;
}

Assistant:

void UnitBoundedPolynomial<Order, Dims>::walk(const double deltatau, void (*fn)(VectorNd, double, const UnitBoundedPolynomial<Order, Dims>&, void *), void *payload, double a, double b) const
{
    double tau = a;
    while (tau <= b)
    {
        if (b - tau < deltatau)
        {
            tau = b;
        }

        fn(interpolate(tau), tau, *this, payload);

        tau += deltatau;
    }
}